

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMatterMeshless::ArchiveOUT(ChMatterMeshless *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::fea::ChMatterMeshless>(marchive);
  ChIndexedNodes::ArchiveOUT(&this->super_ChIndexedNodes,marchive);
  return;
}

Assistant:

void ChMatterMeshless::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMatterMeshless>();

    // serialize the parent class data too
    ChIndexedNodes::ArchiveOUT(marchive);

    // serialize all member data:
    //***TODO
}